

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Square.cpp
# Opt level: O1

Square * __thiscall Square::setLeft(Square *this,Square *sq)

{
  mapped_type *ppSVar1;
  undefined8 uVar2;
  key_type local_40;
  
  (this->adjacents).super__Vector_base<Square_*,_std::allocator<Square_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = sq;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"left","");
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*>_>_>
            ::operator[](&this->adjacentMap,&local_40);
  *ppSVar1 = sq;
  uVar2 = std::__cxx11::string::~string((string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

Square *Square::setLeft(Square *sq) {
    this->adjacents[3] = sq;
    this->adjacentMap["left"] = sq;
}